

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O1

void rr::resolveMultisampleColorBuffer
               (PixelBufferAccess *dst,MultisampleConstPixelBufferAccess *src)

{
  int iVar1;
  int i;
  long lVar2;
  int z;
  int y;
  int y_00;
  Vector<float,_4> res;
  Vec4 sum;
  undefined1 local_68 [16];
  ConstPixelBufferAccess local_58;
  
  iVar1 = (src->m_access).m_size.m_data[0];
  if (iVar1 == 1) {
    MultisampleConstPixelBufferAccess::toSinglesampleAccess(&local_58,src);
    tcu::copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)&local_58);
  }
  else if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]) {
    y_00 = 0;
    do {
      if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]) {
        z = 0;
        do {
          local_58.m_format.order = R;
          local_58.m_format.type = SNORM_INT8;
          local_58.m_size.m_data[0] = 0;
          local_58.m_size.m_data[1] = 0;
          if (0 < (src->m_access).m_size.m_data[0]) {
            y = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_68,(int)src,y,z)
              ;
              lVar2 = 0;
              do {
                local_58.m_size.m_data[lVar2 + -2] =
                     (int)(*(float *)(local_68 + lVar2 * 4) +
                          (float)local_58.m_size.m_data[lVar2 + -2]);
                lVar2 = lVar2 + 1;
              } while (lVar2 != 4);
              y = y + 1;
            } while (y < (src->m_access).m_size.m_data[0]);
          }
          local_68._0_4_ = R;
          local_68._4_4_ = SNORM_INT8;
          local_68._8_4_ = 0;
          local_68._12_4_ = 0;
          lVar2 = 0;
          do {
            *(float *)(local_68 + lVar2 * 4) =
                 (float)local_58.m_size.m_data[lVar2 + -2] * (1.0 / (float)iVar1);
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          tcu::PixelBufferAccess::setPixel(dst,(Vec4 *)local_68,z,y_00,0);
          z = z + 1;
        } while (z < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]);
      }
      y_00 = y_00 + 1;
    } while (y_00 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]);
  }
  return;
}

Assistant:

void resolveMultisampleColorBuffer (const tcu::PixelBufferAccess& dst, const MultisampleConstPixelBufferAccess& src)
{
	DE_ASSERT(dst.getWidth() == src.raw().getHeight());
	DE_ASSERT(dst.getHeight() == src.raw().getDepth());

	if (src.getNumSamples() == 1)
	{
		// fast-path for non-multisampled cases
		tcu::copy(dst, src.toSinglesampleAccess());
	}
	else
	{
		const float numSamplesInv = 1.0f / (float)src.getNumSamples();

		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
		{
			tcu::Vec4 sum;
			for (int s = 0; s < src.raw().getWidth(); s++)
				sum += src.raw().getPixel(s, x, y);

			dst.setPixel(sum*numSamplesInv, x, y);
		}
	}
}